

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

void duckdb::ListGenericFold<double,duckdb::DistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double *pdVar8;
  long lVar9;
  list_entry_t *plVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  byte bVar18;
  double dVar19;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  _Alloc_hider _Var21;
  size_type sVar22;
  char cVar23;
  BoundFunctionExpression *pBVar24;
  reference vector;
  reference pvVar25;
  idx_t iVar26;
  idx_t count;
  Vector *pVVar27;
  Vector *vector_00;
  idx_t iVar28;
  TemplatedValidityData<unsigned_long> *pTVar29;
  UnifiedVectorFormat *pUVar30;
  _Head_base<0UL,_unsigned_long_*,_false> _Var31;
  InvalidInputException *pIVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  VectorType VVar36;
  ValidityMask *in_R8;
  idx_t in_R9;
  UnifiedVectorFormat *pUVar37;
  long lVar38;
  idx_t idx_in_entry;
  uint64_t *puVar39;
  ulong uVar40;
  UnifiedVectorFormat *pUVar41;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t lVar42;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  UnifiedVectorFormat ldata;
  double *rhs_data;
  double *lhs_data;
  UnifiedVectorFormat *local_198;
  uint64_t *local_188;
  UnifiedVectorFormat *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  long local_130;
  string local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  DataChunk *local_d8;
  unsigned_long local_d0;
  UnifiedVectorFormat *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  double *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar24 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  local_198 = *(UnifiedVectorFormat **)(args + 0x18);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  local_d8 = args;
  pvVar25 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  iVar26 = duckdb::ListVector::GetListSize(vector);
  count = duckdb::ListVector::GetListSize(pvVar25);
  pVVar27 = (Vector *)duckdb::ListVector::GetEntry(vector);
  vector_00 = (Vector *)duckdb::ListVector::GetEntry(pvVar25);
  duckdb::Vector::Flatten((ulong)pVVar27);
  duckdb::Vector::Flatten((ulong)vector_00);
  FlatVector::VerifyFlatVector(pVVar27);
  iVar28 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(pVVar27 + 0x28),iVar26);
  if (iVar28 != iVar26) {
    pIVar32 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(pBVar24 + 0x60),
               *(long *)(pBVar24 + 0x68) + *(long *)(pBVar24 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar32,&local_128,&local_50)
    ;
    __cxa_throw(pIVar32,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(vector_00);
  iVar26 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),count);
  if (iVar26 != count) {
    pIVar32 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(pBVar24 + 0x60),
               *(long *)(pBVar24 + 0x68) + *(long *)(pBVar24 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar32,&local_128,&local_70)
    ;
    __cxa_throw(pIVar32,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar24 = pBVar24 + 0x60;
  local_78 = *(undefined1 (*) [8])(pVVar27 + 0x20);
  local_80 = *(double **)(vector_00 + 0x20);
  vVar2 = *vector;
  vVar3 = *pvVar25;
  VVar36 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar36);
    pdVar8 = *(double **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(pvVar25 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar25 + 0x28) & 1) != 0)))) {
      fun.lhs_data = (double **)local_78;
      fun.func_name = (string *)pBVar24;
      fun.rhs_data = &local_80;
      dVar19 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                         (fun,**(list_entry_t **)(vector + 0x20),**(list_entry_t **)(pvVar25 + 0x20)
                          ,in_R8,in_R9);
      *pdVar8 = dVar19;
      goto LAB_00697eaa;
    }
  }
  else {
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar9 = *(long *)(vector + 0x20);
      plVar10 = *(list_entry_t **)(pvVar25 + 0x20);
      if ((*(byte **)(pvVar25 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar25 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar36);
        lVar11 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = local_198;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = local_198;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          _Var31._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8 = local_198;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_128,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_c8);
          sVar22 = local_128._M_string_length;
          _Var21._M_p = local_128._M_dataplus._M_p;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var21._M_p;
          *(size_type *)(result + 0x38) = sVar22;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
          pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var31._M_head_impl =
               (pTVar29->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        *(unsigned_long **)(result + 0x28) = _Var31._M_head_impl;
        if (_Var31._M_head_impl == (unsigned_long *)0x0) {
          if (local_198 != (UnifiedVectorFormat *)0x0) {
            lVar42 = *plVar10;
            local_188 = (uint64_t *)(lVar9 + 8);
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              fun_03.lhs_data = (double **)local_78;
              fun_03.func_name = (string *)pBVar24;
              fun_03.rhs_data = &local_80;
              left_02.length = *local_188;
              left_02.offset = local_188[-1];
              dVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_03,left_02,lVar42,in_R8,in_R9);
              *(double *)(lVar11 + (long)pUVar41 * 8) = dVar19;
              pUVar41 = pUVar41 + 1;
              local_188 = local_188 + 2;
            } while (local_198 != pUVar41);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < local_198 + 0x3f) {
          lVar9 = lVar9 + 8;
          uVar33 = 0;
          pUVar41 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar34 = 0xffffffffffffffff;
            }
            else {
              uVar34 = *(ulong *)(*(long *)(result + 0x28) + uVar33 * 8);
            }
            pUVar30 = pUVar41 + 0x40;
            if (local_198 <= pUVar41 + 0x40) {
              pUVar30 = local_198;
            }
            pUVar37 = pUVar30;
            if (uVar34 != 0) {
              pUVar37 = pUVar41;
              if (uVar34 == 0xffffffffffffffff) {
                if (pUVar41 < pUVar30) {
                  lVar42 = *plVar10;
                  puVar39 = (uint64_t *)((long)pUVar41 * 0x10 + lVar9);
                  do {
                    fun_01.lhs_data = (double **)local_78;
                    fun_01.func_name = (string *)pBVar24;
                    fun_01.rhs_data = &local_80;
                    left_00.length = *puVar39;
                    left_00.offset = puVar39[-1];
                    dVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_01,left_00,lVar42,in_R8,in_R9);
                    *(double *)(lVar11 + (long)pUVar37 * 8) = dVar19;
                    pUVar37 = pUVar37 + 1;
                    puVar39 = puVar39 + 2;
                  } while (pUVar30 != pUVar37);
                }
              }
              else if (pUVar41 < pUVar30) {
                puVar39 = (uint64_t *)((long)pUVar41 * 0x10 + lVar9);
                uVar40 = 0;
                do {
                  if ((uVar34 >> (uVar40 & 0x3f) & 1) != 0) {
                    fun_02.lhs_data = (double **)local_78;
                    fun_02.func_name = (string *)pBVar24;
                    fun_02.rhs_data = &local_80;
                    left_01.length = *puVar39;
                    left_01.offset = puVar39[-1];
                    dVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_02,left_01,*plVar10,in_R8,in_R9);
                    *(double *)(lVar11 + (long)pUVar41 * 8 + uVar40 * 8) = dVar19;
                  }
                  uVar40 = uVar40 + 1;
                  puVar39 = puVar39 + 2;
                } while (pUVar41 + (uVar40 - (long)pUVar30) != (UnifiedVectorFormat *)0x0);
                pUVar37 = pUVar41 + uVar40;
              }
            }
            uVar33 = uVar33 + 1;
            pUVar41 = pUVar37;
          } while (uVar33 != (ulong)(local_198 + 0x3f) >> 6);
        }
        goto LAB_00697eaa;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar9 = *(long *)(vector + 0x20);
          lVar11 = *(long *)(pvVar25 + 0x20);
          local_128._M_dataplus._M_p = (pointer)pBVar24;
          local_128._M_string_length = (size_type)local_78;
          local_128.field_2._M_allocated_capacity = (size_type)&local_80;
          duckdb::Vector::SetVectorType(VVar36);
          lVar38 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pVVar27 = result + 0x28;
          FlatVector::VerifyFlatVector(vector);
          *(UnifiedVectorFormat **)(result + 0x40) = local_198;
          local_148 = local_198;
          if (*(long *)(vector + 0x28) == 0) {
            p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = 0;
            *(undefined8 *)(result + 0x38) = 0;
            if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
            }
            _Var31._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)(vector + 0x28),
                       (unsigned_long *)&local_148);
            p_Var13 = p_Stack_c0;
            pUVar41 = local_c8;
            local_c8 = (UnifiedVectorFormat *)0x0;
            p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar41;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
            if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
            }
            if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
            }
            pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var31._M_head_impl =
                 (pTVar29->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          *(unsigned_long **)pVVar27 = _Var31._M_head_impl;
          FlatVector::VerifyFlatVector(pvVar25);
          pvVar25 = pvVar25 + 0x28;
          if (_Var31._M_head_impl == (unsigned_long *)0x0) {
            *(UnifiedVectorFormat **)(result + 0x40) = local_198;
            if (*(long *)pvVar25 == 0) {
              p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = 0;
              *(undefined8 *)(result + 0x38) = 0;
              local_148 = local_198;
              if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
              }
              _Var31._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_148 = local_198;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)pvVar25,(unsigned_long *)&local_148);
              p_Var13 = p_Stack_c0;
              pUVar41 = local_c8;
              local_c8 = (UnifiedVectorFormat *)0x0;
              p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(UnifiedVectorFormat **)(result + 0x30) = pUVar41;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
              if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
              }
              if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
              }
              pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              _Var31._M_head_impl =
                   (pTVar29->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            *(unsigned_long **)pVVar27 = _Var31._M_head_impl;
          }
          else {
            duckdb::ValidityMask::Combine((ValidityMask *)pVVar27,(ulong)pvVar25);
          }
          if (*(long *)pVVar27 == 0) {
            if (local_198 != (UnifiedVectorFormat *)0x0) {
              lVar35 = 0;
              do {
                fun_10.lhs_data = (double **)local_128._M_string_length;
                fun_10.func_name = (string *)local_128._M_dataplus._M_p;
                fun_10.rhs_data = (double **)local_128.field_2._M_allocated_capacity;
                lVar42.length = *(uint64_t *)(lVar11 + 8 + lVar35 * 2);
                lVar42.offset = *(uint64_t *)(lVar11 + lVar35 * 2);
                left_06.length = *(uint64_t *)(lVar9 + 8 + lVar35 * 2);
                left_06.offset = *(uint64_t *)(lVar9 + lVar35 * 2);
                dVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_10,left_06,lVar42,in_R8,in_R9);
                *(double *)(lVar38 + lVar35) = dVar19;
                lVar35 = lVar35 + 8;
                local_198 = local_198 + -1;
              } while (local_198 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < local_198 + 0x3f) {
            uVar33 = 0;
            pUVar41 = (UnifiedVectorFormat *)0x0;
            local_130 = lVar38;
            do {
              if (*(long *)pVVar27 == 0) {
                uVar34 = 0xffffffffffffffff;
              }
              else {
                uVar34 = *(ulong *)(*(long *)pVVar27 + uVar33 * 8);
              }
              pUVar30 = pUVar41 + 0x40;
              if (local_198 <= pUVar41 + 0x40) {
                pUVar30 = local_198;
              }
              pUVar37 = pUVar30;
              if (uVar34 != 0) {
                pUVar37 = pUVar41;
                if (uVar34 == 0xffffffffffffffff) {
                  if (pUVar41 < pUVar30) {
                    lVar35 = (long)pUVar41 * 2 + 1;
                    do {
                      fun_08.lhs_data = (double **)local_128._M_string_length;
                      fun_08.func_name = (string *)local_128._M_dataplus._M_p;
                      fun_08.rhs_data = (double **)local_128.field_2._M_allocated_capacity;
                      right_04.length = *(uint64_t *)(lVar11 + lVar35 * 8);
                      right_04.offset = *(uint64_t *)(lVar11 + -8 + lVar35 * 8);
                      left_04.length = *(uint64_t *)(lVar9 + lVar35 * 8);
                      left_04.offset = *(uint64_t *)(lVar9 + -8 + lVar35 * 8);
                      dVar19 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_08,left_04,right_04,in_R8,in_R9);
                      *(double *)(lVar38 + (long)pUVar41 * 8) = dVar19;
                      pUVar41 = pUVar41 + 1;
                      lVar35 = lVar35 + 2;
                      pUVar37 = pUVar41;
                    } while (pUVar30 != pUVar41);
                  }
                }
                else {
                  lVar38 = local_130;
                  if (pUVar41 < pUVar30) {
                    lVar38 = local_130 + (long)pUVar41 * 8;
                    lVar35 = (long)pUVar41 * 2 + 1;
                    uVar40 = 0;
                    do {
                      if ((uVar34 >> (uVar40 & 0x3f) & 1) != 0) {
                        fun_09.lhs_data = (double **)local_128._M_string_length;
                        fun_09.func_name = (string *)local_128._M_dataplus._M_p;
                        fun_09.rhs_data = (double **)local_128.field_2._M_allocated_capacity;
                        right_05.length = *(uint64_t *)(lVar11 + lVar35 * 8);
                        right_05.offset = *(uint64_t *)(lVar11 + -8 + lVar35 * 8);
                        left_05.length = *(uint64_t *)(lVar9 + lVar35 * 8);
                        left_05.offset = *(uint64_t *)(lVar9 + -8 + lVar35 * 8);
                        dVar19 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                           (fun_09,left_05,right_05,in_R8,in_R9);
                        *(double *)(lVar38 + uVar40 * 8) = dVar19;
                      }
                      uVar40 = uVar40 + 1;
                      lVar35 = lVar35 + 2;
                    } while (pUVar41 + (uVar40 - (long)pUVar30) != (UnifiedVectorFormat *)0x0);
                    pUVar37 = pUVar41 + uVar40;
                    lVar38 = local_130;
                  }
                }
              }
              uVar33 = uVar33 + 1;
              pUVar41 = pUVar37;
            } while (uVar33 != (ulong)(local_198 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_198);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar25,local_198);
          duckdb::Vector::SetVectorType(VVar36);
          p_Var12 = p_Stack_c0;
          pUVar41 = local_c8;
          sVar22 = local_128._M_string_length;
          _Var21._M_p = local_128._M_dataplus._M_p;
          lVar9 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b8 == 0 && (double **)local_128.field_2._M_allocated_capacity == (double **)0x0)
          {
            if (local_198 != (UnifiedVectorFormat *)0x0) {
              lVar11 = *(long *)_Var21._M_p;
              lVar38 = *(long *)pUVar41;
              pUVar41 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar30 = pUVar41;
                if (lVar11 != 0) {
                  pUVar30 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar11 + (long)pUVar41 * 4);
                }
                pUVar37 = pUVar41;
                if (lVar38 != 0) {
                  pUVar37 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar38 + (long)pUVar41 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar22 + pUVar30 * 0x10))
                        ->_M_use_count;
                uVar14 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar22 + pUVar30 * 0x10))
                         ->_M_weak_count;
                left.length._4_4_ = uVar14;
                left.length._0_4_ = uVar4;
                uVar5 = p_Var12[(long)pUVar37]._M_use_count;
                uVar15 = p_Var12[(long)pUVar37]._M_weak_count;
                right.length._4_4_ = uVar15;
                right.length._0_4_ = uVar5;
                fun_00.lhs_data = (double **)local_78;
                fun_00.func_name = (string *)pBVar24;
                fun_00.rhs_data = &local_80;
                right.offset = (uint64_t)p_Var12[(long)pUVar37]._vptr__Sp_counted_base;
                left.offset = (uint64_t)
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (sVar22 + pUVar30 * 0x10))->_vptr__Sp_counted_base;
                dVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_00,left,right,in_R8,in_R9);
                *(double *)(lVar9 + (long)pUVar41 * 8) = dVar19;
                pUVar41 = pUVar41 + 1;
              } while (local_198 != pUVar41);
            }
          }
          else if (local_198 != (UnifiedVectorFormat *)0x0) {
            lVar11 = *(long *)_Var21._M_p;
            lVar38 = *(long *)pUVar41;
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar30 = pUVar41;
              if (lVar11 != 0) {
                pUVar30 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar11 + (long)pUVar41 * 4);
              }
              pUVar37 = pUVar41;
              if (lVar38 != 0) {
                pUVar37 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar38 + (long)pUVar41 * 4);
              }
              if ((((double **)local_128.field_2._M_allocated_capacity == (double **)0x0) ||
                  (((ulong)*(double **)
                            (local_128.field_2._M_allocated_capacity + ((ulong)pUVar30 >> 6) * 8) >>
                    ((ulong)pUVar30 & 0x3f) & 1) != 0)) &&
                 ((local_b8 == 0 ||
                  ((*(ulong *)(local_b8 + ((ulong)pUVar37 >> 6) * 8) >> ((ulong)pUVar37 & 0x3f) & 1)
                   != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar22 + pUVar30 * 0x10))
                        ->_M_use_count;
                uVar16 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar22 + pUVar30 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar16;
                left_03.length._0_4_ = uVar6;
                uVar7 = p_Var12[(long)pUVar37]._M_use_count;
                uVar17 = p_Var12[(long)pUVar37]._M_weak_count;
                right_00.length._4_4_ = uVar17;
                right_00.length._0_4_ = uVar7;
                fun_04.lhs_data = (double **)local_78;
                fun_04.func_name = (string *)pBVar24;
                fun_04.rhs_data = &local_80;
                right_00.offset = (uint64_t)p_Var12[(long)pUVar37]._vptr__Sp_counted_base;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar22 + pUVar30 * 0x10))->
                     _vptr__Sp_counted_base;
                dVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_04,left_03,right_00,in_R8,in_R9);
                *(double *)(lVar9 + (long)pUVar41 * 8) = dVar19;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_d0 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_148,&local_d0);
                  p_Var20 = p_Stack_140;
                  pUVar30 = local_148;
                  local_148 = (UnifiedVectorFormat *)0x0;
                  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(UnifiedVectorFormat **)(result + 0x30) = pUVar30;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var20;
                  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
                  }
                  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
                  }
                  pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar29->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar18 = (byte)pUVar41 & 0x3f;
                puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar41 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
              }
              pUVar41 = pUVar41 + 1;
            } while (local_198 != pUVar41);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
          }
          if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
          }
        }
        goto LAB_00697eaa;
      }
      plVar10 = *(list_entry_t **)(vector + 0x20);
      lVar9 = *(long *)(pvVar25 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar36);
        lVar11 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(pvVar25);
        *(UnifiedVectorFormat **)(result + 0x40) = local_198;
        if (*(long *)(pvVar25 + 0x28) == 0) {
          p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = local_198;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          _Var31._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8 = local_198;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_128,(unsigned_long **)(pvVar25 + 0x28),
                     (unsigned_long *)&local_c8);
          sVar22 = local_128._M_string_length;
          _Var21._M_p = local_128._M_dataplus._M_p;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var21._M_p;
          *(size_type *)(result + 0x38) = sVar22;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
          pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var31._M_head_impl =
               (pTVar29->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        *(unsigned_long **)(result + 0x28) = _Var31._M_head_impl;
        if (_Var31._M_head_impl == (unsigned_long *)0x0) {
          if (local_198 != (UnifiedVectorFormat *)0x0) {
            lVar42 = *plVar10;
            local_188 = (uint64_t *)(lVar9 + 8);
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              fun_07.lhs_data = (double **)local_78;
              fun_07.func_name = (string *)pBVar24;
              fun_07.rhs_data = &local_80;
              right_03.length = *local_188;
              right_03.offset = local_188[-1];
              dVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_07,lVar42,right_03,in_R8,in_R9);
              *(double *)(lVar11 + (long)pUVar41 * 8) = dVar19;
              pUVar41 = pUVar41 + 1;
              local_188 = local_188 + 2;
            } while (local_198 != pUVar41);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < local_198 + 0x3f) {
          lVar9 = lVar9 + 8;
          uVar33 = 0;
          pUVar41 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar34 = 0xffffffffffffffff;
            }
            else {
              uVar34 = *(ulong *)(*(long *)(result + 0x28) + uVar33 * 8);
            }
            pUVar30 = pUVar41 + 0x40;
            if (local_198 <= pUVar41 + 0x40) {
              pUVar30 = local_198;
            }
            pUVar37 = pUVar30;
            if (uVar34 != 0) {
              pUVar37 = pUVar41;
              if (uVar34 == 0xffffffffffffffff) {
                if (pUVar41 < pUVar30) {
                  lVar42 = *plVar10;
                  puVar39 = (uint64_t *)((long)pUVar41 * 0x10 + lVar9);
                  do {
                    fun_05.lhs_data = (double **)local_78;
                    fun_05.func_name = (string *)pBVar24;
                    fun_05.rhs_data = &local_80;
                    right_01.length = *puVar39;
                    right_01.offset = puVar39[-1];
                    dVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_05,lVar42,right_01,in_R8,in_R9);
                    *(double *)(lVar11 + (long)pUVar37 * 8) = dVar19;
                    pUVar37 = pUVar37 + 1;
                    puVar39 = puVar39 + 2;
                  } while (pUVar30 != pUVar37);
                }
              }
              else if (pUVar41 < pUVar30) {
                puVar39 = (uint64_t *)((long)pUVar41 * 0x10 + lVar9);
                uVar40 = 0;
                do {
                  if ((uVar34 >> (uVar40 & 0x3f) & 1) != 0) {
                    fun_06.lhs_data = (double **)local_78;
                    fun_06.func_name = (string *)pBVar24;
                    fun_06.rhs_data = &local_80;
                    right_02.length = *puVar39;
                    right_02.offset = puVar39[-1];
                    dVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::DistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_06,*plVar10,right_02,in_R8,in_R9);
                    *(double *)(lVar11 + (long)pUVar41 * 8 + uVar40 * 8) = dVar19;
                  }
                  uVar40 = uVar40 + 1;
                  puVar39 = puVar39 + 2;
                } while (pUVar41 + (uVar40 - (long)pUVar30) != (UnifiedVectorFormat *)0x0);
                pUVar37 = pUVar41 + uVar40;
              }
            }
            uVar33 = uVar33 + 1;
            pUVar41 = pUVar37;
          } while (uVar33 != (ulong)(local_198 + 0x3f) >> 6);
        }
        goto LAB_00697eaa;
      }
    }
    duckdb::Vector::SetVectorType(VVar36);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_00697eaa:
  cVar23 = duckdb::DataChunk::AllConstant();
  if (cVar23 != '\0') {
    duckdb::Vector::SetVectorType(VVar36);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}